

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_41304e::SeedHardwareSlow(CSHA512 *hasher)

{
  long lVar1;
  uint64_t uVar2;
  uchar *in_RDI;
  long in_FS_OFFSET;
  int j;
  int i_1;
  int i;
  uint64_t out_1;
  uint64_t out;
  int local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  CSHA512 *in_stack_ffffffffffffffe8;
  CSHA512 *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((anonymous_namespace)::g_rdseed_supported & 1) == 0) {
    if (((anonymous_namespace)::g_rdrand_supported & 1) != 0) {
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        this = (CSHA512 *)0x0;
        for (local_2c = 0; local_2c < 0x400; local_2c = local_2c + 1) {
          uVar2 = GetRdRand();
          this = (CSHA512 *)(uVar2 ^ (ulong)this);
        }
        CSHA512::Write(this,in_RDI,CONCAT44(in_stack_ffffffffffffffdc,iVar3));
      }
    }
  }
  else {
    for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
      GetRdSeed();
      CSHA512::Write(in_stack_ffffffffffffffe8,in_RDI,CONCAT44(iVar3,in_stack_ffffffffffffffd8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SeedHardwareSlow(CSHA512& hasher) noexcept {
#if defined(__x86_64__) || defined(__amd64__) || defined(__i386__)
    // When we want 256 bits of entropy, prefer RdSeed over RdRand, as it's
    // guaranteed to produce independent randomness on every call.
    if (g_rdseed_supported) {
        for (int i = 0; i < 4; ++i) {
            uint64_t out = GetRdSeed();
            hasher.Write((const unsigned char*)&out, sizeof(out));
        }
        return;
    }
    // When falling back to RdRand, XOR the result of 1024 results.
    // This guarantees a reseeding occurs between each.
    if (g_rdrand_supported) {
        for (int i = 0; i < 4; ++i) {
            uint64_t out = 0;
            for (int j = 0; j < 1024; ++j) out ^= GetRdRand();
            hasher.Write((const unsigned char*)&out, sizeof(out));
        }
        return;
    }
#elif defined(__aarch64__) && defined(HWCAP2_RNG)
    if (g_rndr_supported) {
        for (int i = 0; i < 4; ++i) {
            uint64_t out = GetRNDRRS();
            hasher.Write((const unsigned char*)&out, sizeof(out));
        }
        return;
    }
#endif
}